

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O2

void set_params_for_intnl_overlay_frames
               (GF_GROUP *gf_group,int *cur_frame_idx,int *frame_ind,int *first_frame_index,
               int *cur_disp_index,int layer_depth)

{
  int iVar1;
  
  gf_group->update_type[*frame_ind] = '\x05';
  gf_group->arf_src_offset[*frame_ind] = '\0';
  gf_group->cur_frame_idx[*frame_ind] = (uchar)*cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = '\x01';
  gf_group->refbuf_state[*frame_ind] = '\x01';
  iVar1 = *cur_disp_index;
  gf_group->display_idx[*frame_ind] = iVar1;
  *cur_disp_index = iVar1 + 1;
  set_src_offset(gf_group,first_frame_index,*cur_frame_idx,*frame_ind);
  *frame_ind = *frame_ind + 1;
  *cur_frame_idx = *cur_frame_idx + 1;
  return;
}

Assistant:

static inline void set_params_for_intnl_overlay_frames(
    GF_GROUP *const gf_group, int *cur_frame_idx, int *frame_ind,
    int *first_frame_index, int *cur_disp_index, int layer_depth) {
  gf_group->update_type[*frame_ind] = INTNL_OVERLAY_UPDATE;
  gf_group->arf_src_offset[*frame_ind] = 0;
  gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = INTER_FRAME;
  gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
  gf_group->display_idx[*frame_ind] = (*cur_disp_index);
  ++(*cur_disp_index);

  set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
  ++(*frame_ind);
  ++(*cur_frame_idx);
}